

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

path * ghc::filesystem::current_path(path *__return_storage_ptr__,error_code *ec)

{
  error_category *peVar1;
  ulong uVar2;
  char *__buf;
  char *pcVar3;
  int *piVar4;
  format fmt;
  size_t __size;
  allocator<char> local_49;
  long *local_48;
  long local_40;
  long local_38 [2];
  long *plVar5;
  
  peVar1 = (error_category *)std::_V2::system_category();
  ec->_M_value = 0;
  ec->_M_cat = peVar1;
  uVar2 = pathconf(".",4);
  __size = 0x1000;
  if (0x1000 < (int)uVar2) {
    __size = uVar2 & 0xffffffff;
  }
  __buf = (char *)operator_new__(__size + 1);
  pcVar3 = getcwd(__buf,__size);
  if (pcVar3 == (char *)0x0) {
    piVar4 = __errno_location();
    ec->_M_value = *piVar4;
    ec->_M_cat = peVar1;
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    (__return_storage_ptr__->_path)._M_string_length = 0;
    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__buf,&local_49);
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    plVar5 = local_48;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)__return_storage_ptr__,local_48,local_40 + (long)local_48);
    fmt = (format)plVar5;
    if (local_48 != local_38) {
      uVar2 = local_38[0] + 1;
      operator_delete(local_48,uVar2);
      fmt = (format)uVar2;
    }
    path::postprocess_path_with_format(&__return_storage_ptr__->_path,fmt);
  }
  operator_delete__(__buf);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path current_path(std::error_code& ec)
{
    ec.clear();
#ifdef GHC_OS_WINDOWS
    DWORD pathlen = ::GetCurrentDirectoryW(0, 0);
    std::unique_ptr<wchar_t[]> buffer(new wchar_t[size_t(pathlen) + 1]);
    if (::GetCurrentDirectoryW(pathlen, buffer.get()) == 0) {
        ec = detail::make_system_error();
        return path();
    }
    return path(std::wstring(buffer.get()), path::native_format);
#else
    size_t pathlen = static_cast<size_t>(std::max(int(::pathconf(".", _PC_PATH_MAX)), int(PATH_MAX)));
    std::unique_ptr<char[]> buffer(new char[pathlen + 1]);
    if (::getcwd(buffer.get(), pathlen) == nullptr) {
        ec = detail::make_system_error();
        return path();
    }
    return path(buffer.get());
#endif
}